

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.c
# Opt level: O1

Vec_Int_t * prepareFlopVector(Aig_Man_t *pAig,int vectorLength)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < vectorLength - 1U) {
    iVar5 = vectorLength;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar5;
  if (iVar5 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar5 << 2);
  }
  pVVar3->pArray = piVar4;
  if (0 < vectorLength) {
    iVar5 = pVVar3->nSize;
    uVar7 = pVVar3->nCap;
    lVar6 = 0;
    do {
      iVar1 = (int)lVar6;
      uVar2 = uVar7;
      if (iVar5 + iVar1 == uVar7) {
        if ((int)uVar7 < 0x10) {
          if (pVVar3->pArray == (int *)0x0) {
            piVar4 = (int *)malloc(0x40);
          }
          else {
            piVar4 = (int *)realloc(pVVar3->pArray,0x40);
          }
          pVVar3->pArray = piVar4;
          uVar8 = 0x10;
        }
        else {
          uVar8 = uVar7 * 2;
          if ((int)uVar8 <= (int)uVar7) goto LAB_0062a089;
          if (pVVar3->pArray == (int *)0x0) {
            piVar4 = (int *)malloc((ulong)uVar8 << 2);
          }
          else {
            piVar4 = (int *)realloc(pVVar3->pArray,(ulong)uVar8 << 2);
          }
          pVVar3->pArray = piVar4;
        }
        uVar2 = uVar8;
        if (piVar4 == (int *)0x0) {
          pVVar3->nSize = iVar5 + iVar1;
          pVVar3->nCap = uVar7;
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
      }
LAB_0062a089:
      uVar7 = uVar2;
      pVVar3->pArray[iVar5 + lVar6] = iVar1;
      lVar6 = lVar6 + 1;
    } while (vectorLength != (int)lVar6);
    pVVar3->nSize = (int)lVar6 + iVar5;
    pVVar3->nCap = uVar7;
  }
  return pVVar3;
}

Assistant:

Vec_Int_t * prepareFlopVector( Aig_Man_t * pAig, int vectorLength )
{
    Vec_Int_t *vFlops;
    int i;

    vFlops = Vec_IntAlloc( vectorLength );

    for( i=0; i<vectorLength; i++ )
        Vec_IntPush( vFlops, i );

#if 0
    Vec_IntPush( vFlops, 19 );
    Vec_IntPush( vFlops, 20 );
    Vec_IntPush( vFlops, 23 );
    Vec_IntPush( vFlops, 24 );
    //Vec_IntPush( vFlops, 2 );
    //Vec_IntPush( vFlops, 3 );
    //Vec_IntPush( vFlops, 4 );
    //Vec_IntPush( vFlops, 5 );
    //Vec_IntPush( vFlops, 8 );
    //Vec_IntPush( vFlops, 9 );
    //Vec_IntPush( vFlops, 10 );
    //Vec_IntPush( vFlops, 11 );
    //Vec_IntPush( vFlops, 0 );
    //Vec_IntPush( vFlops, 0 );
#endif

    return vFlops;
}